

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

bool __thiscall QWizardPage::isComplete(QWizardPage *this)

{
  bool bVar1;
  QWizardPagePrivate *pQVar2;
  reference pQVar3;
  QLineEdit *pQVar4;
  QAbstractSpinBox *pQVar5;
  QWizardPage *in_RDI;
  long in_FS_OFFSET;
  QAbstractSpinBox *spinBox;
  QLineEdit *lineEdit;
  QWizardField *field;
  QList<QWizardField> *wizardFields;
  QWizardPagePrivate *d;
  const_reverse_iterator it;
  const_reverse_iterator end;
  QVariant value;
  QVariant *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  QList<QWizardField> *in_stack_ffffffffffffff78;
  byte local_39;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QWizardPage *)0x7bcf80);
  if (pQVar2->wizard == (QWizard *)0x0) {
    local_39 = 1;
  }
  else {
    QWizard::d_func((QWizard *)0x7bcfbe);
    QList<QWizardField>::crend(in_stack_ffffffffffffff78);
    QList<QWizardField>::crbegin(in_stack_ffffffffffffff78);
    while (bVar1 = std::operator!=((reverse_iterator<QList<QWizardField>::const_iterator> *)
                                   CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                                   (reverse_iterator<QList<QWizardField>::const_iterator> *)
                                   in_stack_ffffffffffffff68), bVar1) {
      pQVar3 = std::reverse_iterator<QList<QWizardField>::const_iterator>::operator*
                         ((reverse_iterator<QList<QWizardField>::const_iterator> *)
                          CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      if ((pQVar3->page == in_RDI) && ((pQVar3->mandatory & 1U) != 0)) {
        local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::operator_cast_to_char_((QByteArray *)0x7bd0a9);
        QObject::property((char *)local_28.data);
        bVar1 = ::operator==((QVariant *)
                             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                             in_stack_ffffffffffffff68);
        if (bVar1) {
          local_39 = 0;
          bVar1 = true;
        }
        else {
          pQVar4 = qobject_cast<QLineEdit*>((QObject *)0x7bd0f1);
          if ((pQVar4 == (QLineEdit *)0x0) ||
             (bVar1 = QLineEdit::hasAcceptableInput
                                ((QLineEdit *)
                                 CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)),
             bVar1)) {
            pQVar5 = qobject_cast<QAbstractSpinBox*>((QObject *)0x7bd12b);
            if ((pQVar5 == (QAbstractSpinBox *)0x0) ||
               (bVar1 = QAbstractSpinBox::hasAcceptableInput
                                  ((QAbstractSpinBox *)
                                   CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)),
               bVar1)) {
              bVar1 = false;
            }
            else {
              local_39 = 0;
              bVar1 = true;
            }
          }
          else {
            local_39 = 0;
            bVar1 = true;
          }
        }
        ::QVariant::~QVariant((QVariant *)&local_28);
        if (bVar1) goto LAB_007bd18d;
      }
      std::reverse_iterator<QList<QWizardField>::const_iterator>::operator++
                ((reverse_iterator<QList<QWizardField>::const_iterator> *)
                 CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    }
    local_39 = 1;
  }
LAB_007bd18d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_39 & 1);
}

Assistant:

bool QWizardPage::isComplete() const
{
    Q_D(const QWizardPage);

    if (!d->wizard)
        return true;

    const QList<QWizardField> &wizardFields = d->wizard->d_func()->fields;
    const auto end = wizardFields.crend();
    for (auto it = wizardFields.crbegin(); it != end; ++it) {
        const QWizardField &field = *it;
        if (field.page == this && field.mandatory) {
            QVariant value = field.object->property(field.property);
            if (value == field.initialValue)
                return false;

#if QT_CONFIG(lineedit)
            if (QLineEdit *lineEdit = qobject_cast<QLineEdit *>(field.object)) {
                if (!lineEdit->hasAcceptableInput())
                    return false;
            }
#endif
#if QT_CONFIG(spinbox)
            if (QAbstractSpinBox *spinBox = qobject_cast<QAbstractSpinBox *>(field.object)) {
                if (!spinBox->hasAcceptableInput())
                    return false;
            }
#endif
        }
    }
    return true;
}